

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O3

void pair0_sock_send(void *arg,nni_aio *aio)

{
  pair0_pipe *p;
  _Bool _Var1;
  int iVar2;
  nni_msg *m;
  size_t count;
  
  m = nni_aio_get_msg(aio);
  count = nni_msg_len(m);
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  if (*(char *)((long)arg + 0x111) == '\x01') {
    p = *arg;
    _Var1 = nni_lmq_full((nni_lmq *)((long)arg + 0x30));
    if (_Var1) {
      nni_pollable_clear((nni_pollable *)((long)arg + 0x100));
    }
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_aio_finish(aio,NNG_OK,count);
    pair0_pipe_send(p,m);
  }
  else {
    iVar2 = nni_lmq_put((nni_lmq *)((long)arg + 0x30),m);
    if (iVar2 == 0) {
      nni_aio_set_msg(aio,(nni_msg *)0x0);
      nni_aio_finish(aio,NNG_OK,count);
      _Var1 = nni_lmq_full((nni_lmq *)((long)arg + 0x30));
      if (_Var1) {
        nni_pollable_clear((nni_pollable *)((long)arg + 0x100));
      }
    }
    else {
      _Var1 = nni_aio_start(aio,pair0_cancel,arg);
      if (_Var1) {
        nni_aio_list_append((nni_list *)((long)arg + 0x78),aio);
      }
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 8));
  return;
}

Assistant:

static void
pair0_sock_send(void *arg, nni_aio *aio)
{
	pair0_sock *s = arg;
	nni_msg    *m;
	size_t      len;

	m   = nni_aio_get_msg(aio);
	len = nni_msg_len(m);

	nni_mtx_lock(&s->mtx);
	if (s->wr_ready) {
		pair0_pipe *p = s->p;
		if (nni_lmq_full(&s->wmq)) {
			nni_pollable_clear(&s->writable);
		}
		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, len);
		pair0_pipe_send(p, m);
		nni_mtx_unlock(&s->mtx);
		return;
	}

	// Can we maybe queue it.
	if (nni_lmq_put(&s->wmq, m) == 0) {
		// Yay, we can.  So we're done.
		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, len);
		if (nni_lmq_full(&s->wmq)) {
			nni_pollable_clear(&s->writable);
		}
		nni_mtx_unlock(&s->mtx);
		return;
	}

	if (!nni_aio_start(aio, pair0_cancel, s)) {
		nni_mtx_unlock(&s->mtx);
		return;
	}
	nni_aio_list_append(&s->waq, aio);
	nni_mtx_unlock(&s->mtx);
}